

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O0

void kernel::TxOutSer<DataStream>(DataStream *ss,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  CTxOut *in_RSI;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::operator<<(in_RDI,(COutPoint *)in_RSI);
  DataStream::operator<<(in_RDI,(uint *)in_RSI);
  DataStream::operator<<(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TxOutSer(T& ss, const COutPoint& outpoint, const Coin& coin)
{
    ss << outpoint;
    ss << static_cast<uint32_t>((coin.nHeight << 1) + coin.fCoinBase);
    ss << coin.out;
}